

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O2

bool __thiscall FpgaIO::WriteEthernetPhyReset(FpgaIO *this,uint chan)

{
  bool bVar1;
  
  bVar1 = WriteEthernetControl(this,(chan & 2) * 0x4000 + (chan & 1) * 0x80 + 0x4000000);
  return bVar1;
}

Assistant:

bool FpgaIO::WriteEthernetPhyReset(unsigned int chan)
{
    quadlet_t write_data = ETH_CTRL_RESET_PHY;
    if (chan&1)
        write_data |= ETH_PORT_CTRL_RESET_PHY;
    if (chan&2)
        write_data |= (ETH_PORT_CTRL_RESET_PHY<<8);
    return WriteEthernetControl(write_data);
}